

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-slays.c
# Opt level: O3

void copy_brands(_Bool **dest,_Bool *source)

{
  brand_conflict *pbVar1;
  int iVar2;
  _Bool *p_Var3;
  ulong uVar4;
  _Bool *p_Var5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  _Bool *p_Var9;
  
  if (source != (_Bool *)0x0) {
    p_Var3 = *dest;
    if (p_Var3 == (_Bool *)0x0) {
      p_Var3 = (_Bool *)mem_zalloc((ulong)z_info->brand_max);
      *dest = p_Var3;
    }
    uVar6 = (ulong)z_info->brand_max;
    if (uVar6 != 0) {
      uVar4 = 0;
      do {
        p_Var3[uVar4] = (_Bool)(p_Var3[uVar4] | source[uVar4]);
        uVar4 = uVar4 + 1;
      } while (uVar6 != uVar4);
      if (uVar6 != 0) {
        lVar8 = 0;
        uVar4 = 0;
        do {
          pbVar1 = brands;
          if (uVar4 != 0) {
            lVar7 = 0;
            p_Var9 = p_Var3;
            do {
              if (((p_Var3[uVar4] == true) && (*p_Var9 == true)) &&
                 (iVar2 = strcmp(pbVar1[uVar4].name,*(char **)((long)&pbVar1->name + lVar7)),
                 iVar2 == 0)) {
                p_Var5 = p_Var9;
                if (pbVar1[uVar4].multiplier < *(int *)((long)&pbVar1->multiplier + lVar7)) {
                  p_Var5 = p_Var3 + uVar4;
                }
                *p_Var5 = false;
              }
              lVar7 = lVar7 + 0x30;
              p_Var9 = p_Var9 + 1;
            } while (lVar8 != lVar7);
          }
          uVar4 = uVar4 + 1;
          lVar8 = lVar8 + 0x30;
        } while (uVar4 != uVar6);
      }
    }
  }
  return;
}

Assistant:

void copy_brands(bool **dest, bool *source)
{
	int i, j;

	/* Check structures */
	if (!source) return;
	if (!(*dest))
		*dest = mem_zalloc(z_info->brand_max * sizeof(bool));

	/* Copy */
	for (i = 0; i < z_info->brand_max; i++)
		(*dest)[i] |= source[i];

	/* Check for duplicates */
	for (i = 0; i < z_info->brand_max; i++) {
		for (j = 0; j < i; j++) {
			if ((*dest)[i] && (*dest)[j] &&
				streq(brands[i].name, brands[j].name)) {
				if (brands[i].multiplier < brands[j].multiplier) {
					(*dest)[i] = false;
				} else {
					(*dest)[j] = false;
				}
			}
		}
	}
}